

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_query_feature(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  char choice;
  undefined4 local_68;
  wchar_t feature_class;
  wchar_t feata [1];
  wchar_t featr [1];
  wchar_t featp [1];
  wchar_t featg [1];
  wchar_t feath [1];
  wchar_t featc [1];
  wchar_t featz [1];
  wchar_t featu [1];
  wchar_t featb [1];
  wchar_t feato [1];
  wchar_t featf [1];
  wchar_t featq [2];
  wchar_t featm [2];
  wchar_t featt [2];
  wchar_t featd [4];
  
  featf[0] = FEAT_FLOOR;
  feato[0] = FEAT_OPEN;
  featb[0] = FEAT_BROKEN;
  featu[0] = FEAT_LESS;
  featz[0] = FEAT_MORE;
  featt[0] = FEAT_LESS;
  featt[1] = FEAT_MORE;
  featc[0] = FEAT_CLOSED;
  featd[0] = FEAT_CLOSED;
  featd[1] = FEAT_OPEN;
  featd[2] = FEAT_BROKEN;
  featd[3] = FEAT_SECRET;
  feath[0] = FEAT_SECRET;
  featm[0] = FEAT_MAGMA;
  featm[1] = FEAT_MAGMA_K;
  featq[0] = FEAT_QUARTZ;
  featq[1] = FEAT_QUARTZ_K;
  featg[0] = FEAT_GRANITE;
  featp[0] = FEAT_PERM;
  featr[0] = FEAT_RUBBLE;
  feata[0] = FEAT_PASS_RUBBLE;
  wVar2 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&feature_class);
  if (wVar2 != L'\0') {
    _Var1 = get_com("Debug Command Feature Query: ",&choice);
    if (!_Var1) {
      return;
    }
    feature_class = (wchar_t)choice;
    cmd_set_arg_choice((command_conflict *)cmd,"choice",feature_class);
  }
  switch(feature_class) {
  case L'a':
    _choice = feata;
    break;
  case L'b':
    _choice = featb;
    break;
  case L'c':
    _choice = featc;
    break;
  case L'd':
    _choice = featd;
    local_68 = 4;
    goto LAB_00134728;
  default:
    msg("That was an invalid selection.  Use one of fobuztcdhmqgpra .");
    return;
  case L'f':
    _choice = featf;
    break;
  case L'g':
    _choice = featg;
    break;
  case L'h':
    _choice = feath;
    break;
  case L'm':
    _choice = featm;
    goto LAB_001346f0;
  case L'o':
    _choice = feato;
    break;
  case L'p':
    _choice = featp;
    break;
  case L'q':
    _choice = featq;
    goto LAB_001346f0;
  case L'r':
    _choice = featr;
    break;
  case L't':
    _choice = featt;
LAB_001346f0:
    local_68 = 2;
    goto LAB_00134728;
  case L'u':
    _choice = featu;
    break;
  case L'z':
    _choice = featz;
  }
  local_68 = 1;
LAB_00134728:
  wiz_hack_map((chunk *)cave,player,wiz_hack_map_query_feature,&choice);
  Term_redraw();
  msg("Press any key.");
  inkey_ex();
  prt("",L'\0',L'\0');
  prt_map();
  return;
}

Assistant:

void do_cmd_wiz_query_feature(struct command *cmd)
{
	int feature_class;
	struct wiz_query_feature_closure selected;
	/* OMG hax */
	const int featf[] = { FEAT_FLOOR };
	const int feato[] = { FEAT_OPEN };
	const int featb[] = { FEAT_BROKEN };
	const int featu[] = { FEAT_LESS };
	const int featz[] = { FEAT_MORE };
	const int featt[] = { FEAT_LESS, FEAT_MORE };
	const int featc[] = { FEAT_CLOSED };
	const int featd[] = { FEAT_CLOSED, FEAT_OPEN, FEAT_BROKEN,
		FEAT_SECRET };
	const int feath[] = { FEAT_SECRET };
	const int featm[] = { FEAT_MAGMA, FEAT_MAGMA_K };
	const int featq[] = { FEAT_QUARTZ, FEAT_QUARTZ_K };
	const int featg[] = { FEAT_GRANITE };
	const int featp[] = { FEAT_PERM };
	const int featr[] = { FEAT_RUBBLE };
	const int feata[] = { FEAT_PASS_RUBBLE };

	if (cmd_get_arg_choice(cmd, "choice", &feature_class) != CMD_OK) {
		char choice;

		if (!get_com("Debug Command Feature Query: ", &choice)) return;
		feature_class = choice;
		cmd_set_arg_choice(cmd, "choice", feature_class);
	}

	switch (feature_class) {
		/* Floors */
		case 'f':
			selected.features = featf;
			selected.n = (int) N_ELEMENTS(featf);
			break;

		/* Open doors */
		case 'o':
			selected.features = feato;
			selected.n = (int) N_ELEMENTS(feato);
			break;

		/* Broken doors */
		case 'b':
			selected.features = featb;
			selected.n = (int) N_ELEMENTS(featb);
			break;

		/* Upstairs */
		case 'u':
			selected.features = featu;
			selected.n = (int) N_ELEMENTS(featu);
			break;

		/* Downstairs */
		case 'z':
			selected.features = featz;
			selected.n = (int) N_ELEMENTS(featz);
			break;

		/* Stairs */
		case 't':
			selected.features = featt;
			selected.n = (int) N_ELEMENTS(featt);
			break;

		/* Closed doors */
		case 'c':
			selected.features = featc;
			selected.n = (int) N_ELEMENTS(featc);
			break;

		/* Doors */
		case 'd':
			selected.features = featd;
			selected.n = (int) N_ELEMENTS(featd);
			break;

		/* Secret doors */
		case 'h':
			selected.features = feath;
			selected.n = (int) N_ELEMENTS(feath);
			break;

		/* Magma */
		case 'm':
			selected.features = featm;
			selected.n = (int) N_ELEMENTS(featm);
			break;

		/* Quartz */
		case 'q':
			selected.features = featq;
			selected.n = (int) N_ELEMENTS(featq);
			break;

		/* Granite */
		case 'g':
			selected.features = featg;
			selected.n = (int) N_ELEMENTS(featg);
			break;

		/* Permanent wall */
		case 'p':
			selected.features = featp;
			selected.n = (int) N_ELEMENTS(featp);
			break;

		/* Rubble */
		case 'r':
			selected.features = featr;
			selected.n = (int) N_ELEMENTS(featr);
			break;

		/* Passable rubble */
		case 'a':
			selected.features = feata;
			selected.n = (int) N_ELEMENTS(feata);
			break;

		/* Invalid entry */
		default:
			msg("That was an invalid selection.  Use one of fobuztcdhmqgpra .");
			return;
	}

	wiz_hack_map(cave, player, wiz_hack_map_query_feature, &selected);

	Term_redraw();

	msg("Press any key.");
	inkey_ex();
	prt("", 0, 0);

	/* Redraw map */
	prt_map();
}